

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_test.cpp
# Opt level: O2

void test_function<Gudhi::coxeter_triangulation::Function_lemniscate_revolution_in_R3>
               (Function_lemniscate_revolution_in_R3 *fun)

{
  Scalar *pSVar1;
  bool bVar2;
  Index index;
  VectorXd res_seed;
  shared_count sStack_d8;
  VectorXd seed;
  char *local_c0;
  char *local_b8;
  Function_lemniscate_revolution_in_R3 local_b0;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  Gudhi::coxeter_triangulation::Function_lemniscate_revolution_in_R3::seed
            ((Function_lemniscate_revolution_in_R3 *)&seed);
  Gudhi::coxeter_triangulation::Function_lemniscate_revolution_in_R3::seed(&local_b0);
  Gudhi::coxeter_triangulation::Function_lemniscate_revolution_in_R3::operator()
            ((Function_lemniscate_revolution_in_R3 *)&res_seed,(VectorXd *)fun);
  free((void *)local_b0.a_);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x32);
  sStack_d8.pi_ = (sp_counted_base *)0x0;
  local_c0 = "seed.size() == (long int)fun.amb_d()";
  local_b8 = "";
  local_b0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0]._0_1_ = 0;
  local_b0.a_ = (double)&PTR__lazy_ostream_00167d30;
  local_b0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = (double)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
  ;
  local_58 = "";
  local_b0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = (double)&local_c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d8);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x33);
  sStack_d8.pi_ = (sp_counted_base *)0x0;
  local_c0 = "res_seed.size() == (long int)fun.cod_d()";
  local_b8 = "";
  local_b0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0]._0_1_ = 0;
  local_b0.a_ = (double)&PTR__lazy_ostream_00167d30;
  local_b0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = (double)&boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
  ;
  local_88 = "";
  local_b0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = (double)&local_c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d8);
  bVar2 = true;
  index = 0;
  while (bVar2) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&res_seed,
                        index);
    bVar2 = false;
    GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(*pSVar1,0.0,1e-10);
    index = 1;
  }
  free(res_seed.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(seed.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void test_function(const Function& fun) {
  Eigen::VectorXd seed = fun.seed();
  Eigen::VectorXd res_seed = fun(fun.seed());
  BOOST_CHECK(seed.size() == (long int)fun.amb_d());
  BOOST_CHECK(res_seed.size() == (long int)fun.cod_d());
  for (std::size_t i = 0; i < fun.cod_d(); i++) GUDHI_TEST_FLOAT_EQUALITY_CHECK(res_seed(i), 0., 1e-10);
}